

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  InstancePrimitive *prim;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar31 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar22 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar31 = ZEXT1664(auVar22);
  }
  pauVar19 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar1;
  local_f98._0_4_ = uVar1;
  local_f98._8_4_ = uVar1;
  local_f98._12_4_ = uVar1;
  auVar29 = ZEXT1664(local_f98);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar1;
  local_fa8._0_4_ = uVar1;
  local_fa8._8_4_ = uVar1;
  local_fa8._12_4_ = uVar1;
  auVar30 = ZEXT1664(local_fa8);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar1;
  local_fb8._0_4_ = uVar1;
  local_fb8._8_4_ = uVar1;
  local_fb8._12_4_ = uVar1;
  auVar32 = ZEXT1664(local_fb8);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  bVar12 = false;
  do {
    local_fd8 = vsubps_avx(auVar29._0_16_,auVar22);
    fVar5 = auVar22._0_4_;
    fVar6 = auVar22._4_4_;
    fVar7 = auVar22._8_4_;
    fVar8 = auVar22._12_4_;
    local_fe8 = auVar29._0_4_ + fVar5;
    fStack_fe4 = auVar29._4_4_ + fVar6;
    fStack_fe0 = auVar29._8_4_ + fVar7;
    fStack_fdc = auVar29._12_4_ + fVar8;
    local_ff8 = vsubps_avx(auVar30._0_16_,auVar24);
    local_1008 = auVar30._0_4_ + auVar24._0_4_;
    fStack_1004 = auVar30._4_4_ + auVar24._4_4_;
    fStack_1000 = auVar30._8_4_ + auVar24._8_4_;
    fStack_ffc = auVar30._12_4_ + auVar24._12_4_;
    local_1018 = vsubps_avx(auVar32._0_16_,auVar26);
    local_1028._0_4_ = auVar32._0_4_ + auVar26._0_4_;
    local_1028._4_4_ = auVar32._4_4_ + auVar26._4_4_;
    local_1028._8_4_ = auVar32._8_4_ + auVar26._8_4_;
    local_1028._12_4_ = auVar32._12_4_ + auVar26._12_4_;
    local_f88._0_4_ = fVar5 * fVar5;
    local_f88._4_4_ = fVar6 * fVar6;
    local_f88._8_4_ = fVar7 * fVar7;
    local_f88._12_4_ = fVar8 * fVar8;
    auVar33 = ZEXT1664(local_f88);
    local_fc8 = auVar31._0_16_;
LAB_0149dca6:
    do {
      do {
        if (pauVar19 == (undefined1 (*) [16])&local_f78) {
          return bVar12;
        }
        pauVar11 = pauVar19 + -1;
        pauVar19 = pauVar19 + -1;
      } while (auVar31._0_4_ < *(float *)(*pauVar11 + 8));
      uVar14 = *(ulong *)*pauVar19;
LAB_0149dcc4:
      auVar22 = auVar29._0_16_;
      auVar24 = auVar30._0_16_;
      auVar26 = auVar32._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar14 & 8) != 0) goto LAB_0149dfb9;
        auVar9 = *(undefined1 (*) [16])(uVar14 + 0x20);
        auVar23 = *(undefined1 (*) [16])(uVar14 + 0x30);
        auVar10 = vmaxps_avx(auVar22,auVar9);
        auVar10 = vminps_avx(auVar10,auVar23);
        auVar10 = vsubps_avx(auVar10,auVar22);
        auVar22 = vmaxps_avx(auVar24,*(undefined1 (*) [16])(uVar14 + 0x40));
        auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar14 + 0x50));
        auVar24 = vsubps_avx(auVar22,auVar24);
        auVar22 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(uVar14 + 0x60));
        auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar14 + 0x70));
        auVar22 = vsubps_avx(auVar22,auVar26);
        local_1038._4_4_ =
             auVar10._4_4_ * auVar10._4_4_ + auVar24._4_4_ * auVar24._4_4_ +
             auVar22._4_4_ * auVar22._4_4_;
        local_1038._0_4_ =
             auVar10._0_4_ * auVar10._0_4_ + auVar24._0_4_ * auVar24._0_4_ +
             auVar22._0_4_ * auVar22._0_4_;
        fStack_1030 = auVar10._8_4_ * auVar10._8_4_ + auVar24._8_4_ * auVar24._8_4_ +
                      auVar22._8_4_ * auVar22._8_4_;
        fStack_102c = auVar10._12_4_ * auVar10._12_4_ + auVar24._12_4_ * auVar24._12_4_ +
                      auVar22._12_4_ * auVar22._12_4_;
        auVar22 = vcmpps_avx(auVar9,auVar23,2);
        auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0x50),local_ff8,5);
        auVar22 = vandps_avx(auVar22,auVar24);
        auVar10._4_4_ = fStack_fe4;
        auVar10._0_4_ = local_fe8;
        auVar10._8_4_ = fStack_fe0;
        auVar10._12_4_ = fStack_fdc;
        auVar24 = vcmpps_avx(auVar9,auVar10,2);
        auVar9._4_4_ = fStack_1004;
        auVar9._0_4_ = local_1008;
        auVar9._8_4_ = fStack_1000;
        auVar9._12_4_ = fStack_ffc;
        auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0x40),auVar9,2);
        auVar24 = vandps_avx(auVar26,auVar24);
        auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0x70),local_1018,5);
        auVar22 = vandps_avx(auVar22,auVar26);
        auVar26 = vcmpps_avx(auVar23,local_fd8,5);
        auVar9 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0x60),local_1028,2);
        auVar26 = vandps_avx(auVar9,auVar26);
        auVar24 = vandps_avx(auVar24,auVar26);
        auVar22 = vandps_avx(auVar24,auVar22);
LAB_0149dd3c:
        auVar22 = vpslld_avx(auVar22,0x1f);
        uVar13 = vmovmskps_avx(auVar22);
        if (uVar13 != 0) {
          uVar20 = uVar14 & 0xfffffffffffffff0;
          lVar17 = 0;
          for (uVar14 = (ulong)(byte)uVar13; (uVar14 & 1) == 0;
              uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar14 = *(ulong *)(uVar20 + lVar17 * 8);
          uVar13 = (uVar13 & 0xff) - 1 & uVar13 & 0xff;
          uVar15 = (ulong)uVar13;
          if (uVar13 != 0) {
            uVar3 = *(uint *)(local_1038 + lVar17 * 4);
            lVar17 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar17 = lVar17 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar16 = (ulong)uVar13;
            uVar15 = *(ulong *)(uVar20 + lVar17 * 8);
            uVar4 = *(uint *)(local_1038 + lVar17 * 4);
            if (uVar13 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar19 = uVar15;
                *(uint *)(*pauVar19 + 8) = uVar4;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar14;
                *(uint *)(*pauVar19 + 8) = uVar3;
                pauVar19 = pauVar19 + 1;
                uVar14 = uVar15;
              }
            }
            else {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = uVar14;
              auVar22 = vpunpcklqdq_avx(auVar23,ZEXT416(uVar3));
              auVar25._8_8_ = 0;
              auVar25._0_8_ = uVar15;
              auVar24 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar4));
              lVar17 = 0;
              for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar17 = lVar17 + 1;
              }
              uVar13 = uVar13 - 1 & uVar13;
              uVar14 = (ulong)uVar13;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = *(ulong *)(uVar20 + lVar17 * 8);
              auVar9 = vpunpcklqdq_avx(auVar27,ZEXT416(*(uint *)(local_1038 + lVar17 * 4)));
              auVar26 = vpcmpgtd_avx(auVar24,auVar22);
              if (uVar13 == 0) {
                auVar23 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar24,auVar22,auVar23);
                auVar22 = vblendvps_avx(auVar22,auVar24,auVar23);
                auVar24 = vpcmpgtd_avx(auVar9,auVar26);
                auVar23 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar9,auVar26,auVar23);
                auVar26 = vblendvps_avx(auVar26,auVar9,auVar23);
                auVar9 = vpcmpgtd_avx(auVar26,auVar22);
                auVar23 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar26,auVar22,auVar23);
                auVar22 = vblendvps_avx(auVar22,auVar26,auVar23);
                *pauVar19 = auVar22;
                pauVar19[1] = auVar9;
                uVar14 = auVar24._0_8_;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar17 = 0;
                for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                  lVar17 = lVar17 + 1;
                }
                auVar28._8_8_ = 0;
                auVar28._0_8_ = *(ulong *)(uVar20 + lVar17 * 8);
                auVar10 = vpunpcklqdq_avx(auVar28,ZEXT416(*(uint *)(local_1038 + lVar17 * 4)));
                auVar23 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar24,auVar22,auVar23);
                auVar22 = vblendvps_avx(auVar22,auVar24,auVar23);
                auVar24 = vpcmpgtd_avx(auVar10,auVar9);
                auVar23 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar10,auVar9,auVar23);
                auVar9 = vblendvps_avx(auVar9,auVar10,auVar23);
                auVar23 = vpcmpgtd_avx(auVar9,auVar22);
                auVar10 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar9,auVar22,auVar10);
                auVar22 = vblendvps_avx(auVar22,auVar9,auVar10);
                auVar9 = vpcmpgtd_avx(auVar24,auVar26);
                auVar10 = vpshufd_avx(auVar9,0xaa);
                auVar9 = vblendvps_avx(auVar24,auVar26,auVar10);
                auVar24 = vblendvps_avx(auVar26,auVar24,auVar10);
                auVar26 = vpcmpgtd_avx(auVar23,auVar24);
                auVar10 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar23,auVar24,auVar10);
                auVar24 = vblendvps_avx(auVar24,auVar23,auVar10);
                *pauVar19 = auVar22;
                pauVar19[1] = auVar24;
                pauVar19[2] = auVar26;
                uVar14 = auVar9._0_8_;
                pauVar19 = pauVar19 + 3;
              }
            }
          }
          goto LAB_0149dcc4;
        }
        goto LAB_0149dca6;
      }
      if ((uVar14 & 8) == 0) {
        auVar9 = vmaxps_avx(auVar22,*(undefined1 (*) [16])(uVar14 + 0x20));
        auVar23 = vminps_avx(auVar9,*(undefined1 (*) [16])(uVar14 + 0x30));
        auVar9 = vmaxps_avx(auVar24,*(undefined1 (*) [16])(uVar14 + 0x40));
        auVar9 = vminps_avx(auVar9,*(undefined1 (*) [16])(uVar14 + 0x50));
        auVar23 = vsubps_avx(auVar23,auVar22);
        auVar24 = vsubps_avx(auVar9,auVar24);
        auVar22 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(uVar14 + 0x60));
        auVar22 = vminps_avx(auVar22,*(undefined1 (*) [16])(uVar14 + 0x70));
        auVar22 = vsubps_avx(auVar22,auVar26);
        local_1038._0_4_ =
             auVar23._0_4_ * auVar23._0_4_ + auVar24._0_4_ * auVar24._0_4_ +
             auVar22._0_4_ * auVar22._0_4_;
        local_1038._4_4_ =
             auVar23._4_4_ * auVar23._4_4_ + auVar24._4_4_ * auVar24._4_4_ +
             auVar22._4_4_ * auVar22._4_4_;
        fStack_1030 = auVar23._8_4_ * auVar23._8_4_ + auVar24._8_4_ * auVar24._8_4_ +
                      auVar22._8_4_ * auVar22._8_4_;
        fStack_102c = auVar23._12_4_ * auVar23._12_4_ + auVar24._12_4_ * auVar24._12_4_ +
                      auVar22._12_4_ * auVar22._12_4_;
        auVar22 = vcmpps_avx(_local_1038,auVar33._0_16_,2);
        auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0x20),
                             *(undefined1 (*) [16])(uVar14 + 0x30),2);
        auVar22 = vandps_avx(auVar22,auVar24);
        goto LAB_0149dd3c;
      }
LAB_0149dfb9:
      lVar17 = (ulong)((uint)uVar14 & 0xf) - 8;
      prim = (InstancePrimitive *)(uVar14 & 0xfffffffffffffff0);
      bVar18 = 0;
      while (bVar21 = lVar17 != 0, lVar17 = lVar17 + -1, bVar21) {
        bVar21 = InstanceIntersector1::pointQuery(query,context,prim);
        auVar33 = ZEXT1664(local_f88);
        auVar32 = ZEXT1664(local_fb8);
        auVar30 = ZEXT1664(local_fa8);
        auVar29 = ZEXT1664(local_f98);
        bVar18 = bVar18 | bVar21;
        prim = prim + 1;
      }
      auVar31 = ZEXT1664(local_fc8);
    } while (bVar18 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar22._4_4_ = uVar1;
    auVar22._0_4_ = uVar1;
    auVar22._8_4_ = uVar1;
    auVar22._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar24._4_4_ = uVar1;
    auVar24._0_4_ = uVar1;
    auVar24._8_4_ = uVar1;
    auVar24._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar26._4_4_ = uVar1;
    auVar26._0_4_ = uVar1;
    auVar26._8_4_ = uVar1;
    auVar26._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar31 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar9 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar31 = ZEXT1664(auVar9);
    }
    bVar12 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }